

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O2

void __thiscall I2sAnalyzerSettings::I2sAnalyzerSettings(I2sAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  Channel *this_02;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_03;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_04;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_05;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_06;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_07;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_08;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_09;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_10;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_11;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_12;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_13;
  AnalyzerSettingInterfaceChannel *pAVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  ulong uVar3;
  Channel *pCVar4;
  char *pcVar5;
  U32 i;
  uint uVar6;
  char str [256];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__I2sAnalyzerSettings_0010cd70;
  this_00 = &this->mClockChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_01 = &this->mFrameChannel;
  Channel::Channel(this_01,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_02 = &this->mDataChannel;
  uVar3 = 0xffffffffffffffff;
  Channel::Channel(this_02,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mShiftOrder = MsbFirst;
  this->mDataValidEdge = NegEdge;
  this->mBitsPerWord = 0x10;
  this->mWordAlignment = LEFT_ALIGNED;
  this->mFrameType = FRAME_TRANSITION_ONCE_EVERY_WORD;
  this->mBitAlignment = BITS_SHIFTED_RIGHT_1;
  this->mSigned = UnsignedInteger;
  this->mWordSelectInverted = WS_NOT_INVERTED;
  this_03 = &this->mClockChannelInterface;
  this_04 = &this->mFrameChannelInterface;
  this_05 = &this->mDataChannelInterface;
  this_06 = &this->mShiftOrderInterface;
  this_07 = &this->mDataValidEdgeInterface;
  this_08 = &this->mBitsPerWordInterface;
  this_09 = &this->mFrameTypeInterface;
  this_10 = &this->mWordAlignmentInterface;
  this_11 = &this->mBitAlignmentInterface;
  this_12 = &this->mSignedInterface;
  this_13 = &this->mWordSelectInvertedInterface;
  (this->mClockChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mFrameChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mDataChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mShiftOrderInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mDataValidEdgeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitsPerWordInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mFrameTypeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mWordAlignmentInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitAlignmentInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mSignedInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mWordSelectInvertedInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_03,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03->_M_ptr,"CLOCK channel");
  pCVar4 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_03->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_04,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_04->_M_ptr,"FRAME");
  pCVar4 = this_01;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_04->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_05,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_05->_M_ptr,"DATA");
  pCVar4 = this_02;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_05->_M_ptr);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_06,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_06->_M_ptr,"DATA Significant Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_06->_M_ptr,"Most Significant Bit Sent First");
  pcVar5 = "Least Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_06->_M_ptr,"Least Significant Bit Sent First");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_07,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_07->_M_ptr,"CLOCK State");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_07->_M_ptr,"Falling edge");
  pcVar5 = "Rising edge";
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_07->_M_ptr,"Rising edge");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataValidEdge);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_08,pAVar2);
  pcVar5 = "Audio Bit Depth (bits/sample)";
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)this_08->_M_ptr,"Audio Bit Depth (bits/sample)");
  for (uVar6 = 2; uVar6 != 0x41; uVar6 = uVar6 + 1) {
    sprintf(str,"%d Bits/Word",(ulong)uVar6);
    pcVar5 = str;
    AnalyzerSettingInterfaceNumberList::AddNumber((double)(int)uVar6,(char *)this_08->_M_ptr,str);
  }
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerWord);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_09,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_09->_M_ptr,"FRAME Signal Transitions");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_09->_M_ptr,"Twice each word");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_09->_M_ptr,"Once each word (I2S, PCM standard)");
  pcVar5 = "Twice every 4 words";
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_09->_M_ptr,"Twice every 4 words");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mFrameType);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_10,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_10->_M_ptr,"DATA Bits Alignment");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_10->_M_ptr,"Left aligned");
  pcVar5 = "Right aligned";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_10->_M_ptr,"Right aligned");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mWordAlignment);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_11,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_11->_M_ptr,"DATA Bits Shift");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_11->_M_ptr,"Right-shifted by one (I2S typical)");
  pcVar5 = "No shift (PCM standard)";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_11->_M_ptr,"No shift (PCM standard)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitAlignment);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_12,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_12->_M_ptr,"Signed/Unsigned");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_12->_M_ptr,"Unsigned");
  pcVar5 = "Signed (two\'s complement)";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_12->_M_ptr,"Signed (two\'s complement)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSigned);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_13,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_13->_M_ptr,"Word Select High");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_13->_M_ptr,"Channel 2 (right - I2S typical)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_13->_M_ptr,"Channel 1 (left - inverted)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mWordSelectInverted);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,false);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_02,true);
  return;
}

Assistant:

I2sAnalyzerSettings::I2sAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ),
      mFrameChannel( UNDEFINED_CHANNEL ),
      mDataChannel( UNDEFINED_CHANNEL ),

      mShiftOrder( AnalyzerEnums::MsbFirst ),
      mDataValidEdge( AnalyzerEnums::NegEdge ),
      mBitsPerWord( 16 ),

      mWordAlignment( LEFT_ALIGNED ),
      mFrameType( FRAME_TRANSITION_ONCE_EVERY_WORD ),
      mBitAlignment( BITS_SHIFTED_RIGHT_1 ),
      mSigned( AnalyzerEnums::UnsignedInteger ),
      mWordSelectInverted( WS_NOT_INVERTED )
{
    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "CLOCK channel", "Clock, aka I2S SCK - Continuous Serial Clock, aka Bit Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mFrameChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mFrameChannelInterface->SetTitleAndTooltip( "FRAME", "Frame Delimiter / aka I2S WS - Word Select, aka Sampling Clock" );
    mFrameChannelInterface->SetChannel( mFrameChannel );

    mDataChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mDataChannelInterface->SetTitleAndTooltip( "DATA", "Data, aka I2S SD - Serial Data" );
    mDataChannelInterface->SetChannel( mDataChannel );


    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "DATA Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );

    mDataValidEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mDataValidEdgeInterface->SetTitleAndTooltip( "CLOCK State",
                                                 "Specify if data is valid (should be read) on the rising, or falling clock edge." );
    mDataValidEdgeInterface->AddNumber( AnalyzerEnums::NegEdge, "Falling edge", "" );
    mDataValidEdgeInterface->AddNumber( AnalyzerEnums::PosEdge, "Rising edge", "" );
    mDataValidEdgeInterface->SetNumber( mDataValidEdge );

    mBitsPerWordInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerWordInterface->SetTitleAndTooltip( "Audio Bit Depth (bits/sample)",
                                               "Specify the number of audio bits/word.  Any additional bits will be ignored" );
    char str[ 256 ];
    for( U32 i = 2; i <= 64; i++ )
    {
        sprintf( str, "%d Bits/Word", i );
        mBitsPerWordInterface->AddNumber( i, str, "" );
    }
    mBitsPerWordInterface->SetNumber( mBitsPerWord );


    // enum PcmFrameType { FRAME_TRANSITION_TWICE_EVERY_WORD, FRAME_TRANSITION_ONCE_EVERY_WORD, FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS };
    mFrameTypeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mFrameTypeInterface->SetTitleAndTooltip( "FRAME Signal Transitions", "Specify the type of frame signal used." );
    mFrameTypeInterface->AddNumber( FRAME_TRANSITION_TWICE_EVERY_WORD, "Twice each word", "" );
    mFrameTypeInterface->AddNumber( FRAME_TRANSITION_ONCE_EVERY_WORD, "Once each word (I2S, PCM standard)", "" );
    mFrameTypeInterface->AddNumber( FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS, "Twice every 4 words", "" );
    mFrameTypeInterface->SetNumber( mFrameType );

    mWordAlignmentInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mWordAlignmentInterface->SetTitleAndTooltip( "DATA Bits Alignment",
                                                 "Specify whether data bits are left or right aligned with respect to FRAME edges. Only "
                                                 "needed if more bits are sent than needed each frame, and additional bits are ignored." );
    mWordAlignmentInterface->AddNumber( LEFT_ALIGNED, "Left aligned", "" );
    mWordAlignmentInterface->AddNumber( RIGHT_ALIGNED, "Right aligned", "" );
    mWordAlignmentInterface->SetNumber( mWordAlignment );

    // enum PcmBitAlignment { FIRST_FRAME_BIT_BELONGS_TO_PREVIOUS_WORD, FIRST_FRAME_BIT_BELONGS_TO_CURRENT_WORD };
    mBitAlignmentInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitAlignmentInterface->SetTitleAndTooltip( "DATA Bits Shift", "Specify the bit shift with respect to the FRAME edges" );
    mBitAlignmentInterface->AddNumber( BITS_SHIFTED_RIGHT_1, "Right-shifted by one (I2S typical)", "" );
    mBitAlignmentInterface->AddNumber( NO_SHIFT, "No shift (PCM standard)", "" );
    mBitAlignmentInterface->SetNumber( mBitAlignment );

    mSignedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mSignedInterface->SetTitleAndTooltip(
        "Signed/Unsigned", "Select whether samples are unsigned or signed values (only shows up if the display type is decimal)" );
    mSignedInterface->AddNumber( AnalyzerEnums::UnsignedInteger, "Unsigned", "Interpret samples as unsigned integers" );
    mSignedInterface->AddNumber( AnalyzerEnums::SignedInteger, "Signed (two's complement)",
                                 "Interpret samples as signed integers -- only when display type is set to decimal" );
    mSignedInterface->SetNumber( mSigned );


    mWordSelectInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mWordSelectInvertedInterface->SetTitleAndTooltip( "Word Select High", "Select whether Word Select high is channel 1 or channel 2" );
    mWordSelectInvertedInterface->AddNumber( WS_NOT_INVERTED, "Channel 2 (right - I2S typical)",
                                             "when word select (FRAME) is logic 1, data is channel 2." );
    mWordSelectInvertedInterface->AddNumber( WS_INVERTED, "Channel 1 (left - inverted)",
                                             "when word select (FRAME) is logic 1, data is channel 1." );
    mWordSelectInvertedInterface->SetNumber( mWordSelectInverted );

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mFrameChannelInterface.get() );
    AddInterface( mDataChannelInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mDataValidEdgeInterface.get() );
    AddInterface( mBitsPerWordInterface.get() );
    AddInterface( mFrameTypeInterface.get() );
    AddInterface( mWordAlignmentInterface.get() );
    AddInterface( mBitAlignmentInterface.get() );
    AddInterface( mSignedInterface.get() );
    AddInterface( mWordSelectInvertedInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", false );
    AddChannel( mFrameChannel, "PCM FRAME", false );
    AddChannel( mDataChannel, "PCM DATA", false );
}